

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlocale_tools.cpp
# Opt level: O2

QString * qdtoa(QString *__return_storage_ptr__,qreal d,int *decpt,int *sign)

{
  long in_FS_OFFSET;
  QLatin1StringView latin1;
  int length;
  int nonNullDecpt;
  bool nonNullSign;
  undefined1 *local_38;
  undefined1 *puStack_30;
  undefined2 local_28;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  nonNullSign = false;
  nonNullDecpt = 0;
  length = 0;
  local_38 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_30 = &DAT_aaaaaaaaaaaaaaaa;
  local_28 = 0xaaaa;
  qt_doubleToAscii(d,DFSignificantDigits,-0x80,(char *)&local_38,0x12,&nonNullSign,&length,
                   &nonNullDecpt);
  if (sign != (int *)0x0) {
    *sign = (uint)nonNullSign;
  }
  if (decpt != (int *)0x0) {
    *decpt = nonNullDecpt;
  }
  latin1.m_size = (long)length;
  latin1.m_data = (char *)&local_38;
  QString::QString(__return_storage_ptr__,latin1);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

QString qdtoa(qreal d, int *decpt, int *sign)
{
    bool nonNullSign = false;
    int nonNullDecpt = 0;
    int length = 0;

    // Some versions of libdouble-conversion like an extra digit, probably for '\0'
    constexpr qsizetype digits = std::numeric_limits<double>::max_digits10 + 1;
    char result[digits];
    qt_doubleToAscii(d, QLocaleData::DFSignificantDigits, QLocale::FloatingPointShortest,
                     result, digits, nonNullSign, length, nonNullDecpt);

    if (sign)
        *sign = nonNullSign ? 1 : 0;
    if (decpt)
        *decpt = nonNullDecpt;

    return QLatin1StringView(result, length);
}